

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::checkAssertCall(CheckerVisitor *this,CallExpr *call)

{
  TreeOp TVar1;
  int iVar2;
  size_type_conflict sVar3;
  Node *this_00;
  Id *this_01;
  SQChar *__s2;
  ArenaVector<SQCompilation::Expr_*> *pAVar4;
  CallExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *cond;
  SQUnsignedInteger argSize;
  Expr *callee;
  VarScope *in_stack_00000038;
  VarScope *in_stack_00000040;
  Expr *in_stack_00000048;
  CheckerVisitor *in_stack_00000050;
  Expr *in_stack_ffffffffffffffc8;
  
  CallExpr::callee(in_RSI);
  this_00 = &maybeEval(in_RDI,in_stack_ffffffffffffffc8,false)->super_Node;
  TVar1 = Node::op(this_00);
  if (TVar1 == TO_ID) {
    this_01 = Node::asId(this_00);
    __s2 = Id::id(this_01);
    iVar2 = strcmp("assert",__s2);
    if (iVar2 == 0) {
      pAVar4 = CallExpr::arguments(in_RSI);
      sVar3 = ArenaVector<SQCompilation::Expr_*>::size(pAVar4);
      if ((sVar3 != 0) && (sVar3 < 3)) {
        pAVar4 = CallExpr::arguments(in_RSI);
        ArenaVector<SQCompilation::Expr_*>::operator[](pAVar4,0);
        speculateIfConditionHeuristics
                  (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                   this._7_1_);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkAssertCall(const CallExpr *call) {

  // assert(x != null) or assert(x != null, "X should not be null")

  const Expr *callee = maybeEval(call->callee());

  if (callee->op() != TO_ID)
    return;

  if (strcmp("assert", callee->asId()->id()) != 0)
    return;


  const SQUnsignedInteger argSize = call->arguments().size();

  if (!argSize || argSize > 2)
    return;

  const Expr *cond = call->arguments()[0];

  speculateIfConditionHeuristics(cond, currentScope, nullptr);
}